

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::MetaVariable::get_value<std::__cxx11::string>
          (MetaVariable *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  
  if (dst == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    pbVar1 = tinyusdz::value::Value::as<std::__cxx11::string>(&this->_value,false);
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      ::std::__cxx11::string::_M_assign((string *)dst);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool get_value(T *dst) const {
    if (!dst) {
      return false;
    }

    if (const T *v = _value.as<T>()) {
      (*dst) = *v;
      return true;
    }

    return false;
  }